

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O2

bool __thiscall
ON_UuidIndexList::AddUuidIndex
          (ON_UuidIndexList *this,ON_UUID uuid,int index,bool bCheckForDupicates)

{
  bool bVar1;
  ON_UuidIndex *pOVar2;
  undefined3 in_register_00000081;
  ON_UUID_struct local_28;
  
  local_28.Data4 = uuid.Data4;
  local_28._0_8_ = uuid._0_8_;
  if ((CONCAT31(in_register_00000081,bCheckForDupicates) != 0) &&
     (bVar1 = FindUuid(this,uuid,(int *)0x0), bVar1)) {
    return false;
  }
  bVar1 = ::operator==(&ON_max_uuid,&local_28);
  if (!bVar1) {
    pOVar2 = ON_SimpleArray<ON_UuidIndex>::AppendNew(&this->super_ON_SimpleArray<ON_UuidIndex>);
    (pOVar2->m_id).Data1 = local_28.Data1;
    (pOVar2->m_id).Data2 = local_28.Data2;
    (pOVar2->m_id).Data3 = local_28.Data3;
    *&(pOVar2->m_id).Data4 = local_28.Data4;
    pOVar2->m_i = index;
  }
  return !bVar1;
}

Assistant:

bool ON_UuidIndexList::AddUuidIndex(ON_UUID uuid, int index, bool bCheckForDupicates)
{
  bool rc = bCheckForDupicates ? !FindUuid(uuid,nullptr) : true;
  if (rc)
  {
    if ( ON_max_uuid == uuid )
      rc = 0;
    else
    {
      ON_UuidIndex& ui = AppendNew();
      ui.m_id = uuid;
      ui.m_i = index;
    }
  }
  return rc;
}